

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O2

void __thiscall
imrt::EvaluationFunction::get_vc_sorted_beamlets
          (EvaluationFunction *this,Plan *p,vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax,
          multimap<double,_std::pair<imrt::Station_*,_int>,_imrt::MagnitudeCompare,_std::allocator<std::pair<const_double,_std::pair<imrt::Station_*,_int>_>_>_>
          *sorted_set)

{
  Station *this_00;
  int iVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  int b;
  int b_00;
  double dVar4;
  pair<double,_double> pVar5;
  pair<double,_std::pair<imrt::Station_*,_int>_> local_48;
  
  p_Var2 = (_List_node_base *)Plan::get_stations_abi_cxx11_(p);
  p_Var3 = p_Var2;
  while (p_Var3 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                   &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != p_Var2) {
    this_00 = (Station *)p_Var3[1]._M_next;
    for (b_00 = 0; iVar1 = Station::getNbBeamlets(this_00), b_00 < iVar1; b_00 = b_00 + 1) {
      pVar5 = get_value_cost(this,this_00->angle,b_00,Zmin,Zmax);
      dVar4 = pVar5.first / pVar5.second;
      if ((dVar4 != 0.0) || (NAN(dVar4))) {
        local_48.first = dVar4;
        local_48.second.first = this_00;
        local_48.second.second = b_00;
        std::
        _Rb_tree<double,std::pair<double_const,std::pair<imrt::Station*,int>>,std::_Select1st<std::pair<double_const,std::pair<imrt::Station*,int>>>,imrt::MagnitudeCompare,std::allocator<std::pair<double_const,std::pair<imrt::Station*,int>>>>
        ::_M_emplace_equal<std::pair<double,std::pair<imrt::Station*,int>>>
                  ((_Rb_tree<double,std::pair<double_const,std::pair<imrt::Station*,int>>,std::_Select1st<std::pair<double_const,std::pair<imrt::Station*,int>>>,imrt::MagnitudeCompare,std::allocator<std::pair<double_const,std::pair<imrt::Station*,int>>>>
                    *)sorted_set,&local_48);
      }
    }
  }
  return;
}

Assistant:

void EvaluationFunction::get_vc_sorted_beamlets(Plan& p, vector<double>& Zmin, vector<double>& Zmax,
		multimap < double, pair<Station*, int>, MagnitudeCompare >& sorted_set){
	//the sorted set of beamlets

	double max_ev=0.0;
	for(auto s:p.get_stations()){
		for(int b=0; b<s->getNbBeamlets(); b++){
			pair<double,double> value_cost=get_value_cost(s->getAngle(), b, Zmin, Zmax);
            double ev=value_cost.first/value_cost.second;
			if(ev==0) continue;
			sorted_set.insert(make_pair (ev,  make_pair(s,b)));
		}
	}

}